

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_get_token(char **ptr,char *delimiter,char *token,int *isanumber)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int *piVar4;
  undefined4 *in_RCX;
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  double dval;
  int slen;
  char tval [73];
  char *loc;
  char local_78 [72];
  undefined1 local_30;
  char *local_28;
  undefined4 *local_20;
  char *local_18;
  long *local_8;
  
  *in_RDX = '\0';
  while (*(char *)*in_RDI == ' ') {
    *in_RDI = *in_RDI + 1;
  }
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  sVar2 = strcspn((char *)*in_RDI,in_RSI);
  iVar1 = (int)sVar2;
  if (iVar1 != 0) {
    strncat(local_18,(char *)*local_8,(long)iVar1);
    *local_8 = *local_8 + (long)iVar1;
    if (local_20 != (undefined4 *)0x0) {
      *local_20 = 1;
      pcVar3 = strchr(local_18,0x44);
      if (pcVar3 == (char *)0x0) {
        strtod(local_18,&local_28);
      }
      else {
        strncpy(local_78,local_18,0x48);
        local_30 = 0;
        local_28 = strchr(local_78,0x44);
        if (local_28 != (char *)0x0) {
          *local_28 = 'E';
        }
        strtod(local_78,&local_28);
      }
      if ((*local_28 != '\0') && (*local_28 != ' ')) {
        *local_20 = 0;
      }
      piVar4 = __errno_location();
      if (*piVar4 == 0x22) {
        *local_20 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int fits_get_token(char **ptr, 
                   char *delimiter,
                   char *token,
                   int *isanumber)   /* O - is this token a number? */
/*
   parse off the next token, delimited by a character in 'delimiter',
   from the input ptr string;  increment *ptr to the end of the token.
   Returns the length of the token, not including the delimiter char;
*/
{
    char *loc, tval[73];
    int slen;
    double dval;
    
    *token = '\0';

    while (**ptr == ' ')  /* skip over leading blanks */
        (*ptr)++;

    slen = strcspn(*ptr, delimiter);  /* length of next token */
    if (slen)
    {
        strncat(token, *ptr, slen);       /* copy token */

        (*ptr) += slen;                   /* skip over the token */

        if (isanumber)  /* check if token is a number */
        {
            *isanumber = 1;

	    if (strchr(token, 'D'))  {
	        strncpy(tval, token, 72);
		tval[72] = '\0';

	        /*  The C language does not support a 'D'; replace with 'E' */
	        if ((loc = strchr(tval, 'D'))) *loc = 'E';

	        dval =  strtod(tval, &loc);
	    } else {
	        dval =  strtod(token, &loc);
 	    }

	    /* check for read error, or junk following the value */
	    if (*loc != '\0' && *loc != ' ' ) *isanumber = 0;
	    if (errno == ERANGE) *isanumber = 0;
        }
    }

    return(slen);
}